

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Adjuster.cxx
# Opt level: O0

int __thiscall Fl_Adjuster::handle(Fl_Adjuster *this,int event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  double local_d0;
  double local_b8;
  Fl_Widget_Tracker local_50;
  Fl_Widget_Tracker wp_1;
  Fl_Widget_Tracker local_38;
  Fl_Widget_Tracker wp;
  int mx;
  int delta;
  double v;
  int event_local;
  Fl_Adjuster *this_local;
  
  wp.wp_._0_4_ = Fl::event_x();
  switch(event) {
  case 1:
    iVar5 = Fl::visible_focus();
    if (iVar5 != 0) {
      Fl::focus((Fl_Widget *)this);
    }
    this->ix = (int)wp.wp_;
    iVar1 = Fl_Widget::w((Fl_Widget *)this);
    iVar2 = Fl_Widget::h((Fl_Widget *)this);
    iVar5 = (int)wp.wp_;
    if (iVar1 < iVar2) {
      iVar5 = Fl::event_y();
      iVar1 = Fl_Widget::y((Fl_Widget *)this);
      iVar2 = Fl_Widget::h((Fl_Widget *)this);
      *(int *)&(this->super_Fl_Valuator).field_0xa4 = 3 - (((iVar5 - iVar1) + -1) * 3) / iVar2;
    }
    else {
      iVar1 = Fl_Widget::x((Fl_Widget *)this);
      iVar2 = Fl_Widget::w((Fl_Widget *)this);
      *(int *)&(this->super_Fl_Valuator).field_0xa4 = ((iVar5 - iVar1) * 3) / iVar2 + 1;
    }
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_38,(Fl_Widget *)this);
    Fl_Valuator::handle_push(&this->super_Fl_Valuator);
    iVar5 = Fl_Widget_Tracker::deleted(&local_38);
    if (iVar5 != 0) {
      this_local._4_4_ = 1;
    }
    wp_1.wp_._1_3_ = 0;
    wp_1.wp_._0_1_ = iVar5 != 0;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_38);
    if ((uint)wp_1.wp_ == 0) {
      Fl_Widget::redraw((Fl_Widget *)this);
      this_local._4_4_ = 1;
    }
    break;
  case 2:
    iVar5 = Fl::event_is_click();
    if (iVar5 != 0) {
      uVar4 = Fl::event_state();
      if ((uVar4 & 0xf0000) == 0) {
        wp.wp_._4_4_ = 10;
      }
      else {
        wp.wp_._4_4_ = -10;
      }
      iVar5 = *(int *)&(this->super_Fl_Valuator).field_0xa4;
      if (iVar5 == 2) {
        dVar6 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
        _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,wp.wp_._4_4_ * 10);
      }
      else if (iVar5 == 3) {
        dVar6 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
        _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,wp.wp_._4_4_);
      }
      else {
        dVar6 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
        _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,wp.wp_._4_4_ * 100);
      }
      Fl_Widget_Tracker::Fl_Widget_Tracker(&local_50,(Fl_Widget *)this);
      iVar5 = soft(this);
      if (iVar5 == 0) {
        local_d0 = Fl_Valuator::clamp(&this->super_Fl_Valuator,_mx);
      }
      else {
        local_d0 = Fl_Valuator::softclamp(&this->super_Fl_Valuator,_mx);
      }
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,local_d0);
      iVar5 = Fl_Widget_Tracker::deleted(&local_50);
      if (iVar5 != 0) {
        this_local._4_4_ = 1;
      }
      wp_1.wp_._1_3_ = 0;
      wp_1.wp_._0_1_ = iVar5 != 0;
      Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_50);
      if ((uint)wp_1.wp_ != 0) {
        return this_local._4_4_;
      }
    }
    *(undefined4 *)&(this->super_Fl_Valuator).field_0xa4 = 0;
    Fl_Widget::redraw((Fl_Widget *)this);
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    this_local._4_4_ = 1;
    break;
  case 3:
  case 4:
    this_local._4_4_ = 1;
    break;
  case 5:
    iVar1 = Fl_Widget::w((Fl_Widget *)this);
    iVar2 = Fl_Widget::h((Fl_Widget *)this);
    iVar5 = (int)wp.wp_;
    if (iVar1 < iVar2) {
      iVar2 = Fl_Widget::x((Fl_Widget *)this);
      iVar1 = (int)wp.wp_;
      if (iVar5 < iVar2) {
        iVar5 = Fl_Widget::x((Fl_Widget *)this);
        wp.wp_._4_4_ = iVar1 - iVar5;
      }
      else {
        iVar2 = Fl_Widget::x((Fl_Widget *)this);
        iVar3 = Fl_Widget::w((Fl_Widget *)this);
        iVar5 = (int)wp.wp_;
        if (iVar2 + iVar3 < iVar1) {
          iVar1 = Fl_Widget::x((Fl_Widget *)this);
          iVar2 = Fl_Widget::w((Fl_Widget *)this);
          wp.wp_._4_4_ = (iVar5 - iVar1) - iVar2;
        }
        else {
          wp.wp_._4_4_ = 0;
        }
      }
    }
    else {
      iVar3 = Fl_Widget::x((Fl_Widget *)this);
      iVar5 = *(int *)&(this->super_Fl_Valuator).field_0xa4;
      iVar2 = Fl_Widget::w((Fl_Widget *)this);
      iVar1 = (int)wp.wp_;
      iVar3 = iVar3 + ((iVar5 + -1) * iVar2) / 3;
      if ((int)wp.wp_ < iVar3) {
        wp.wp_._4_4_ = (int)wp.wp_ - iVar3;
      }
      else {
        wp.wp_._4_4_ = iVar3;
        iVar5 = Fl_Widget::w((Fl_Widget *)this);
        if (iVar3 + iVar5 / 3 < iVar1) {
          iVar5 = (int)wp.wp_ - wp.wp_._4_4_;
          iVar1 = Fl_Widget::w((Fl_Widget *)this);
          wp.wp_._4_4_ = iVar5 - iVar1 / 3;
        }
        else {
          wp.wp_._4_4_ = 0;
        }
      }
    }
    iVar5 = *(int *)&(this->super_Fl_Valuator).field_0xa4;
    if (iVar5 == 2) {
      dVar6 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
      _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,wp.wp_._4_4_ * 10);
    }
    else if (iVar5 == 3) {
      dVar6 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
      _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,wp.wp_._4_4_);
    }
    else {
      dVar6 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
      _mx = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,wp.wp_._4_4_ * 100);
    }
    iVar5 = soft(this);
    if (iVar5 == 0) {
      local_b8 = Fl_Valuator::clamp(&this->super_Fl_Valuator,_mx);
    }
    else {
      local_b8 = Fl_Valuator::softclamp(&this->super_Fl_Valuator,_mx);
    }
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,local_b8);
    this_local._4_4_ = 1;
    break;
  case 6:
  case 7:
    iVar5 = Fl::visible_focus();
    if (iVar5 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      Fl_Widget::redraw((Fl_Widget *)this);
      this_local._4_4_ = 1;
    }
    break;
  case 8:
    iVar5 = Fl::event_key();
    switch(iVar5) {
    case 0xff51:
      iVar5 = Fl_Widget::w((Fl_Widget *)this);
      iVar1 = Fl_Widget::h((Fl_Widget *)this);
      if (iVar5 < iVar1) {
        this_local._4_4_ = 0;
      }
      else {
        dVar6 = Fl_Valuator::value(&this->super_Fl_Valuator);
        dVar6 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,-1);
        dVar6 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar6);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar6);
        this_local._4_4_ = 1;
      }
      break;
    case 0xff52:
      iVar5 = Fl_Widget::w((Fl_Widget *)this);
      iVar1 = Fl_Widget::h((Fl_Widget *)this);
      if (iVar1 < iVar5) {
        this_local._4_4_ = 0;
      }
      else {
        dVar6 = Fl_Valuator::value(&this->super_Fl_Valuator);
        dVar6 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,-1);
        dVar6 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar6);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar6);
        this_local._4_4_ = 1;
      }
      break;
    case 0xff53:
      iVar5 = Fl_Widget::w((Fl_Widget *)this);
      iVar1 = Fl_Widget::h((Fl_Widget *)this);
      if (iVar5 < iVar1) {
        this_local._4_4_ = 0;
      }
      else {
        dVar6 = Fl_Valuator::value(&this->super_Fl_Valuator);
        dVar6 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,1);
        dVar6 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar6);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar6);
        this_local._4_4_ = 1;
      }
      break;
    case 0xff54:
      iVar5 = Fl_Widget::w((Fl_Widget *)this);
      iVar1 = Fl_Widget::h((Fl_Widget *)this);
      if (iVar1 < iVar5) {
        this_local._4_4_ = 0;
      }
      else {
        dVar6 = Fl_Valuator::value(&this->super_Fl_Valuator);
        dVar6 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar6,1);
        dVar6 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar6);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar6);
        this_local._4_4_ = 1;
      }
      break;
    default:
      this_local._4_4_ = 0;
    }
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Adjuster::handle(int event) {
  double v;
  int delta;
  int mx = Fl::event_x();
  // Fl_Widget_Tracker wp(this);
  switch (event) {
    case FL_PUSH:
      if (Fl::visible_focus()) Fl::focus(this);
      ix = mx;
      if (w()>=h())
	drag = 3*(mx-x())/w() + 1;
      else
	drag = 3-3*(Fl::event_y()-y()-1)/h();
      { Fl_Widget_Tracker wp(this);
	handle_push();
	if (wp.deleted()) return 1;
      }
      redraw();
      return 1;
    case FL_DRAG:
      if (w() >= h()) {
	delta = x()+(drag-1)*w()/3;	// left edge of button
	if (mx < delta)
	  delta = mx-delta;
	else if (mx > (delta+w()/3)) // right edge of button
	  delta = mx-delta-w()/3;
	else
	  delta = 0;
      } else {
	if (mx < x())
	  delta = mx-x();
	else if (mx > (x()+w()))
	  delta = mx-x()-w();
	else
	  delta = 0;
      }
      switch (drag) {
	case 3: v = increment(previous_value(), delta); break;
	case 2: v = increment(previous_value(), delta*10); break;
	default:v = increment(previous_value(), delta*100); break;
      }
      handle_drag(soft() ? softclamp(v) : clamp(v));
      return 1;
    case FL_RELEASE:
      if (Fl::event_is_click()) { // detect click but no drag
	if (Fl::event_state()&0xF0000) delta = -10;
	else delta = 10;
	switch (drag) {
	  case 3: v = increment(previous_value(), delta); break;
	  case 2: v = increment(previous_value(), delta*10); break;
	  default:v = increment(previous_value(), delta*100); break;
	}
	Fl_Widget_Tracker wp(this);
	handle_drag(soft() ? softclamp(v) : clamp(v));
	if (wp.deleted()) return 1;
      }
      drag = 0;
      redraw();
      handle_release();
      return 1;
    case FL_KEYBOARD :
      switch (Fl::event_key()) {
	case FL_Up:
          if (w() > h()) return 0;
	  handle_drag(clamp(increment(value(),-1)));
	  return 1;
	case FL_Down:
          if (w() > h()) return 0;
	  handle_drag(clamp(increment(value(),1)));
	  return 1;
	case FL_Left:
          if (w() < h()) return 0;
	  handle_drag(clamp(increment(value(),-1)));
	  return 1;
	case FL_Right:
          if (w() < h()) return 0;
	  handle_drag(clamp(increment(value(),1)));
	  return 1;
	default:
          return 0;
      }
      // break not required because of switch...

    case FL_FOCUS:
    case FL_UNFOCUS:
      if (Fl::visible_focus()) {
        redraw();
        return 1;
      } else return 0;

    case FL_ENTER :
    case FL_LEAVE :
      return 1;
  }
  return 0;
}